

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelativeConditionalWrapper.cpp
# Opt level: O2

Statement * __thiscall
IRT::RelativeConditionalWrapper::ToConditional
          (RelativeConditionalWrapper *this,Label *true_label,Label *false_label)

{
  LogicOperatorType type;
  Expression *left;
  Expression *right;
  JumpConditionalStatement *pJVar1;
  Label local_78;
  Label local_58;
  JumpConditionalStatement *local_38;
  
  local_38 = (JumpConditionalStatement *)operator_new(0x60);
  type = this->operator_type_;
  left = this->lhs_;
  right = this->rhs_;
  std::__cxx11::string::string((string *)&local_78,(string *)true_label);
  std::__cxx11::string::string((string *)&local_58,(string *)false_label);
  pJVar1 = local_38;
  JumpConditionalStatement::JumpConditionalStatement(local_38,type,left,right,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return &pJVar1->super_Statement;
}

Assistant:

Statement *RelativeConditionalWrapper::ToConditional(Label true_label, Label false_label) {
    return new JumpConditionalStatement(
        operator_type_,
        lhs_,
        rhs_,
        true_label,
        false_label
    );
}